

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBTypes.cpp
# Opt level: O2

U16 __thiscall USBPacket::CalcCRC16(USBPacket *this)

{
  pointer puVar1;
  uint uVar2;
  uint uVar3;
  pointer puVar4;
  byte bVar5;
  uint uVar6;
  
  puVar1 = (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = 0xffff;
  for (puVar4 = (pointer)0x2;
      puVar4 < (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish + (-2 - (long)puVar1); puVar4 = puVar4 + 1)
  {
    for (bVar5 = 1; bVar5 != 0; bVar5 = bVar5 * '\x02') {
      uVar3 = uVar2 & 0xffff;
      uVar6 = uVar3 >> 1;
      uVar2 = uVar6 ^ 0xffffa001;
      if ((((bVar5 & puVar4[(long)puVar1]) == 0 ^ (byte)uVar3) & 1) != 0) {
        uVar2 = uVar6;
      }
    }
  }
  return ~(ushort)uVar2;
}

Assistant:

U16 USBPacket::CalcCRC16() const
{
    size_t counter;
    U16 crc_register = 0xffff;
    U16 polynom = 0xA001;
    U8 shift_register, data_bit, crc_bit;

    for( counter = 2; counter < mData.size() - 2; counter++ )
    {
        for( shift_register = 0x01; shift_register > 0x00; shift_register <<= 1 )
        {
            data_bit = ( mData[ counter ] & shift_register ) ? 1 : 0;
            crc_bit = crc_register & 1;

            crc_register >>= 1;

            if( data_bit ^ crc_bit )
                crc_register ^= polynom;
        }
    }

    return ~crc_register;
}